

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

int __thiscall QTreeView::rowHeight(QTreeView *this,QModelIndex *index)

{
  int iVar1;
  QTreeViewPrivate *this_00;
  undefined8 in_RDI;
  int i;
  QTreeViewPrivate *d;
  QModelIndex *in_stack_00000038;
  QTreeViewPrivate *in_stack_00000040;
  int item;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  item = (int)((ulong)in_RDI >> 0x20);
  this_00 = d_func((QTreeView *)0x8ff94c);
  QAbstractItemViewPrivate::executePostedLayout(&this_00->super_QAbstractItemViewPrivate);
  iVar1 = QTreeViewPrivate::viewIndex(in_stack_00000040,in_stack_00000038);
  if (iVar1 == -1) {
    iVar1 = 0;
  }
  else {
    iVar1 = QTreeViewPrivate::itemHeight
                      ((QTreeViewPrivate *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),item);
  }
  return iVar1;
}

Assistant:

int QTreeView::rowHeight(const QModelIndex &index) const
{
    Q_D(const QTreeView);
    d->executePostedLayout();
    int i = d->viewIndex(index);
    if (i == -1)
        return 0;
    return d->itemHeight(i);
}